

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itoa.h
# Opt level: O0

char * rapidjson::internal::u64toa(uint64_t value,char *buffer)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  uint uVar7;
  char *pcVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  char *pcVar15;
  uint32_t d8_1;
  uint32_t d7_1;
  uint32_t d6_1;
  uint32_t d5_1;
  uint32_t c1_1;
  uint32_t b1_1;
  uint32_t d4_2;
  uint32_t d3_2;
  uint32_t d2_3;
  uint32_t d1_3;
  uint32_t c0_1;
  uint32_t b0_1;
  uint32_t v1_1;
  uint32_t v0_1;
  uint32_t j;
  uint32_t i_2;
  uint32_t i_1;
  uint32_t i;
  uint32_t a;
  uint32_t d8;
  uint32_t d7;
  uint32_t d6;
  uint32_t d5;
  uint32_t c1;
  uint32_t b1;
  uint32_t d4_1;
  uint32_t d3_1;
  uint32_t d2_2;
  uint32_t d1_2;
  uint32_t c0;
  uint32_t b0;
  uint32_t v1;
  uint32_t v0;
  uint32_t d4;
  uint32_t d3;
  uint32_t d2_1;
  uint32_t d1_1;
  uint32_t c;
  uint32_t b;
  uint32_t d2;
  uint32_t d1;
  uint32_t v;
  uint64_t kTen16;
  uint64_t kTen15;
  uint64_t kTen14;
  uint64_t kTen13;
  uint64_t kTen12;
  uint64_t kTen11;
  uint64_t kTen10;
  uint64_t kTen9;
  uint64_t kTen8;
  char *cDigitsLut;
  char *buffer_local;
  uint64_t value_local;
  
  if (buffer == (char *)0x0) {
    __assert_fail("buffer != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/internal/itoa.h"
                  ,0x7f,"char *rapidjson::internal::u64toa(uint64_t, char *)");
  }
  pcVar8 = GetDigitsLut();
  cDigitsLut = buffer;
  if (value < 100000000) {
    uVar11 = (uint)value;
    if (uVar11 < 10000) {
      uVar6 = (uVar11 / 100) * 2;
      uVar9 = (uVar11 % 100) * 2;
      if (999 < uVar11) {
        cDigitsLut = buffer + 1;
        *buffer = pcVar8[uVar6];
      }
      if (99 < uVar11) {
        *cDigitsLut = pcVar8[uVar6 + 1];
        cDigitsLut = cDigitsLut + 1;
      }
      if (9 < uVar11) {
        *cDigitsLut = pcVar8[uVar9];
        cDigitsLut = cDigitsLut + 1;
      }
      *cDigitsLut = pcVar8[uVar9 + 1];
      cDigitsLut = cDigitsLut + 1;
    }
    else {
      uVar6 = ((uVar11 / 10000) / 100) * 2;
      uVar10 = ((uVar11 / 10000) % 100) * 2;
      uVar9 = ((uVar11 % 10000) / 100) * 2;
      uVar11 = ((uVar11 % 10000) % 100) * 2;
      if (9999999 < value) {
        cDigitsLut = buffer + 1;
        *buffer = pcVar8[uVar6];
      }
      if (999999 < value) {
        *cDigitsLut = pcVar8[uVar6 + 1];
        cDigitsLut = cDigitsLut + 1;
      }
      if (99999 < value) {
        *cDigitsLut = pcVar8[uVar10];
        cDigitsLut = cDigitsLut + 1;
      }
      *cDigitsLut = pcVar8[uVar10 + 1];
      cDigitsLut[1] = pcVar8[uVar9];
      cDigitsLut[2] = pcVar8[uVar9 + 1];
      pcVar15 = cDigitsLut + 4;
      cDigitsLut[3] = pcVar8[uVar11];
      cDigitsLut = cDigitsLut + 5;
      *pcVar15 = pcVar8[uVar11 + 1];
    }
  }
  else if (value < 10000000000000000) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = value;
    uVar11 = SUB164(auVar1 / ZEXT816(100000000),0);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = value;
    uVar6 = SUB164(auVar2 % ZEXT816(100000000),0);
    uVar9 = uVar11 / 10000;
    uVar11 = uVar11 % 10000;
    uVar10 = (uVar9 / 100) * 2;
    uVar12 = (uVar9 % 100) * 2;
    uVar9 = (uVar11 / 100) * 2;
    uVar13 = (uVar11 % 100) * 2;
    uVar11 = uVar6 / 10000;
    uVar6 = uVar6 % 10000;
    uVar7 = (uVar11 / 100) * 2;
    uVar14 = (uVar11 % 100) * 2;
    uVar11 = (uVar6 / 100) * 2;
    uVar6 = (uVar6 % 100) * 2;
    if (999999999999999 < value) {
      cDigitsLut = buffer + 1;
      *buffer = pcVar8[uVar10];
    }
    if (99999999999999 < value) {
      *cDigitsLut = pcVar8[uVar10 + 1];
      cDigitsLut = cDigitsLut + 1;
    }
    if (9999999999999 < value) {
      *cDigitsLut = pcVar8[uVar12];
      cDigitsLut = cDigitsLut + 1;
    }
    if (999999999999 < value) {
      *cDigitsLut = pcVar8[uVar12 + 1];
      cDigitsLut = cDigitsLut + 1;
    }
    if (99999999999 < value) {
      *cDigitsLut = pcVar8[uVar9];
      cDigitsLut = cDigitsLut + 1;
    }
    if (9999999999 < value) {
      *cDigitsLut = pcVar8[uVar9 + 1];
      cDigitsLut = cDigitsLut + 1;
    }
    if (999999999 < value) {
      *cDigitsLut = pcVar8[uVar13];
      cDigitsLut = cDigitsLut + 1;
    }
    *cDigitsLut = pcVar8[uVar13 + 1];
    cDigitsLut[1] = pcVar8[uVar7];
    cDigitsLut[2] = pcVar8[uVar7 + 1];
    cDigitsLut[3] = pcVar8[uVar14];
    cDigitsLut[4] = pcVar8[uVar14 + 1];
    cDigitsLut[5] = pcVar8[uVar11];
    cDigitsLut[6] = pcVar8[uVar11 + 1];
    cDigitsLut[7] = pcVar8[uVar6];
    cDigitsLut[8] = pcVar8[uVar6 + 1];
    cDigitsLut = cDigitsLut + 9;
  }
  else {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = value;
    uVar11 = SUB164(auVar3 / ZEXT816(10000000000000000),0);
    if (uVar11 < 10) {
      cDigitsLut = buffer + 1;
      *buffer = SUB161(auVar3 / ZEXT816(10000000000000000),0) + '0';
    }
    else if (uVar11 < 100) {
      *buffer = pcVar8[uVar11 * 2];
      cDigitsLut = buffer + 2;
      buffer[1] = pcVar8[uVar11 * 2 + 1];
    }
    else if (uVar11 < 1000) {
      *buffer = (char)((ulong)uVar11 / 100) + '0';
      uVar11 = (uVar11 % 100) * 2;
      buffer[1] = pcVar8[uVar11];
      cDigitsLut = buffer + 3;
      buffer[2] = pcVar8[uVar11 + 1];
    }
    else {
      uVar6 = (uVar11 / 100) * 2;
      uVar11 = (uVar11 % 100) * 2;
      *buffer = pcVar8[uVar6];
      buffer[1] = pcVar8[uVar6 + 1];
      buffer[2] = pcVar8[uVar11];
      cDigitsLut = buffer + 4;
      buffer[3] = pcVar8[uVar11 + 1];
    }
    auVar4._8_8_ = 0;
    auVar4._0_8_ = value % 10000000000000000;
    uVar11 = SUB164(auVar4 / ZEXT816(100000000),0);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = value % 10000000000000000;
    uVar6 = SUB164(auVar5 % ZEXT816(100000000),0);
    uVar9 = uVar11 / 10000;
    uVar11 = uVar11 % 10000;
    uVar10 = (uVar9 / 100) * 2;
    uVar12 = (uVar9 % 100) * 2;
    uVar9 = (uVar11 / 100) * 2;
    uVar13 = (uVar11 % 100) * 2;
    uVar11 = uVar6 / 10000;
    uVar6 = uVar6 % 10000;
    uVar7 = (uVar11 / 100) * 2;
    uVar14 = (uVar11 % 100) * 2;
    uVar11 = (uVar6 / 100) * 2;
    uVar6 = (uVar6 % 100) * 2;
    *cDigitsLut = pcVar8[uVar10];
    cDigitsLut[1] = pcVar8[uVar10 + 1];
    cDigitsLut[2] = pcVar8[uVar12];
    cDigitsLut[3] = pcVar8[uVar12 + 1];
    cDigitsLut[4] = pcVar8[uVar9];
    cDigitsLut[5] = pcVar8[uVar9 + 1];
    cDigitsLut[6] = pcVar8[uVar13];
    cDigitsLut[7] = pcVar8[uVar13 + 1];
    cDigitsLut[8] = pcVar8[uVar7];
    cDigitsLut[9] = pcVar8[uVar7 + 1];
    cDigitsLut[10] = pcVar8[uVar14];
    cDigitsLut[0xb] = pcVar8[uVar14 + 1];
    cDigitsLut[0xc] = pcVar8[uVar11];
    cDigitsLut[0xd] = pcVar8[uVar11 + 1];
    cDigitsLut[0xe] = pcVar8[uVar6];
    cDigitsLut[0xf] = pcVar8[uVar6 + 1];
    cDigitsLut = cDigitsLut + 0x10;
  }
  return cDigitsLut;
}

Assistant:

inline char* u64toa(uint64_t value, char* buffer) {
    RAPIDJSON_ASSERT(buffer != 0);
    const char* cDigitsLut = GetDigitsLut();
    const uint64_t  kTen8 = 100000000;
    const uint64_t  kTen9 = kTen8 * 10;
    const uint64_t kTen10 = kTen8 * 100;
    const uint64_t kTen11 = kTen8 * 1000;
    const uint64_t kTen12 = kTen8 * 10000;
    const uint64_t kTen13 = kTen8 * 100000;
    const uint64_t kTen14 = kTen8 * 1000000;
    const uint64_t kTen15 = kTen8 * 10000000;
    const uint64_t kTen16 = kTen8 * kTen8;

    if (value < kTen8) {
        uint32_t v = static_cast<uint32_t>(value);
        if (v < 10000) {
            const uint32_t d1 = (v / 100) << 1;
            const uint32_t d2 = (v % 100) << 1;

            if (v >= 1000)
                *buffer++ = cDigitsLut[d1];
            if (v >= 100)
                *buffer++ = cDigitsLut[d1 + 1];
            if (v >= 10)
                *buffer++ = cDigitsLut[d2];
            *buffer++ = cDigitsLut[d2 + 1];
        }
        else {
            // value = bbbbcccc
            const uint32_t b = v / 10000;
            const uint32_t c = v % 10000;

            const uint32_t d1 = (b / 100) << 1;
            const uint32_t d2 = (b % 100) << 1;

            const uint32_t d3 = (c / 100) << 1;
            const uint32_t d4 = (c % 100) << 1;

            if (value >= 10000000)
                *buffer++ = cDigitsLut[d1];
            if (value >= 1000000)
                *buffer++ = cDigitsLut[d1 + 1];
            if (value >= 100000)
                *buffer++ = cDigitsLut[d2];
            *buffer++ = cDigitsLut[d2 + 1];

            *buffer++ = cDigitsLut[d3];
            *buffer++ = cDigitsLut[d3 + 1];
            *buffer++ = cDigitsLut[d4];
            *buffer++ = cDigitsLut[d4 + 1];
        }
    }
    else if (value < kTen16) {
        const uint32_t v0 = static_cast<uint32_t>(value / kTen8);
        const uint32_t v1 = static_cast<uint32_t>(value % kTen8);

        const uint32_t b0 = v0 / 10000;
        const uint32_t c0 = v0 % 10000;

        const uint32_t d1 = (b0 / 100) << 1;
        const uint32_t d2 = (b0 % 100) << 1;

        const uint32_t d3 = (c0 / 100) << 1;
        const uint32_t d4 = (c0 % 100) << 1;

        const uint32_t b1 = v1 / 10000;
        const uint32_t c1 = v1 % 10000;

        const uint32_t d5 = (b1 / 100) << 1;
        const uint32_t d6 = (b1 % 100) << 1;

        const uint32_t d7 = (c1 / 100) << 1;
        const uint32_t d8 = (c1 % 100) << 1;

        if (value >= kTen15)
            *buffer++ = cDigitsLut[d1];
        if (value >= kTen14)
            *buffer++ = cDigitsLut[d1 + 1];
        if (value >= kTen13)
            *buffer++ = cDigitsLut[d2];
        if (value >= kTen12)
            *buffer++ = cDigitsLut[d2 + 1];
        if (value >= kTen11)
            *buffer++ = cDigitsLut[d3];
        if (value >= kTen10)
            *buffer++ = cDigitsLut[d3 + 1];
        if (value >= kTen9)
            *buffer++ = cDigitsLut[d4];

        *buffer++ = cDigitsLut[d4 + 1];
        *buffer++ = cDigitsLut[d5];
        *buffer++ = cDigitsLut[d5 + 1];
        *buffer++ = cDigitsLut[d6];
        *buffer++ = cDigitsLut[d6 + 1];
        *buffer++ = cDigitsLut[d7];
        *buffer++ = cDigitsLut[d7 + 1];
        *buffer++ = cDigitsLut[d8];
        *buffer++ = cDigitsLut[d8 + 1];
    }
    else {
        const uint32_t a = static_cast<uint32_t>(value / kTen16); // 1 to 1844
        value %= kTen16;

        if (a < 10)
            *buffer++ = static_cast<char>('0' + static_cast<char>(a));
        else if (a < 100) {
            const uint32_t i = a << 1;
            *buffer++ = cDigitsLut[i];
            *buffer++ = cDigitsLut[i + 1];
        }
        else if (a < 1000) {
            *buffer++ = static_cast<char>('0' + static_cast<char>(a / 100));

            const uint32_t i = (a % 100) << 1;
            *buffer++ = cDigitsLut[i];
            *buffer++ = cDigitsLut[i + 1];
        }
        else {
            const uint32_t i = (a / 100) << 1;
            const uint32_t j = (a % 100) << 1;
            *buffer++ = cDigitsLut[i];
            *buffer++ = cDigitsLut[i + 1];
            *buffer++ = cDigitsLut[j];
            *buffer++ = cDigitsLut[j + 1];
        }

        const uint32_t v0 = static_cast<uint32_t>(value / kTen8);
        const uint32_t v1 = static_cast<uint32_t>(value % kTen8);

        const uint32_t b0 = v0 / 10000;
        const uint32_t c0 = v0 % 10000;

        const uint32_t d1 = (b0 / 100) << 1;
        const uint32_t d2 = (b0 % 100) << 1;

        const uint32_t d3 = (c0 / 100) << 1;
        const uint32_t d4 = (c0 % 100) << 1;

        const uint32_t b1 = v1 / 10000;
        const uint32_t c1 = v1 % 10000;

        const uint32_t d5 = (b1 / 100) << 1;
        const uint32_t d6 = (b1 % 100) << 1;

        const uint32_t d7 = (c1 / 100) << 1;
        const uint32_t d8 = (c1 % 100) << 1;

        *buffer++ = cDigitsLut[d1];
        *buffer++ = cDigitsLut[d1 + 1];
        *buffer++ = cDigitsLut[d2];
        *buffer++ = cDigitsLut[d2 + 1];
        *buffer++ = cDigitsLut[d3];
        *buffer++ = cDigitsLut[d3 + 1];
        *buffer++ = cDigitsLut[d4];
        *buffer++ = cDigitsLut[d4 + 1];
        *buffer++ = cDigitsLut[d5];
        *buffer++ = cDigitsLut[d5 + 1];
        *buffer++ = cDigitsLut[d6];
        *buffer++ = cDigitsLut[d6 + 1];
        *buffer++ = cDigitsLut[d7];
        *buffer++ = cDigitsLut[d7 + 1];
        *buffer++ = cDigitsLut[d8];
        *buffer++ = cDigitsLut[d8 + 1];
    }

    return buffer;
}